

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

FiniteAutomaton *
Omega_h::FiniteAutomaton::simplify_once(FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *fa)

{
  int iVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  long lVar4;
  size_type sVar5;
  int iVar6;
  uint uVar7;
  size_type __n;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar8;
  reference rVar9;
  int next_state;
  vector<bool,_std::allocator<bool>_> did_simple;
  uint local_98;
  int local_94;
  _Bvector_base<std::allocator<bool>_> local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
  local_68;
  
  local_68._M_impl.super__Rb_tree_key_compare<Omega_h::StateRowLess>._M_key_compare.accepted =
       &fa->accepted_tokens;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar4 = 0;
  __n = 0;
  local_68._M_impl.super__Rb_tree_key_compare<Omega_h::StateRowLess>._M_key_compare.table =
       &fa->table;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    iVar1 = get_nrows<int>(&fa->table);
    if (iVar1 <= lVar4) break;
    local_90._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)((__n << 0x20) + lVar4);
    pVar8 = std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,Omega_h::StateRowLess,std::allocator<std::pair<int_const,int>>>
            ::_M_emplace_unique<std::pair<int,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,Omega_h::StateRowLess,std::allocator<std::pair<int_const,int>>>
                        *)&local_68,(pair<int,_int> *)&local_90);
    __n = (size_type)((int)__n + (uint)(pVar8.second & 1));
    lVar4 = lVar4 + 1;
  }
  FiniteAutomaton(__return_storage_ptr__,(fa->table).ncols + (uint)fa->is_deterministic * 2 + -2,
                  fa->is_deterministic,(int)__n);
  sVar5 = __n;
  while (iVar1 = (int)sVar5, sVar5 = (size_type)(iVar1 - 1), iVar1 != 0) {
    add_state(__return_storage_ptr__);
  }
  local_98 = local_98 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_90,__n,(bool *)&local_98,
             (allocator_type *)&local_94);
  uVar7 = 0;
  while( true ) {
    local_98 = uVar7;
    iVar1 = get_nrows<int>(&fa->table);
    if (iVar1 <= (int)uVar7) {
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_68);
      return __return_storage_ptr__;
    }
    sVar2 = std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>::
            count((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                   *)&local_68,(key_type *)&local_98);
    if (sVar2 == 0) break;
    pmVar3 = std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_68,(key_type *)&local_98);
    iVar1 = *pmVar3;
    rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)&local_90,iVar1);
    if ((*rVar9._M_p & rVar9._M_mask) == 0) {
      for (iVar6 = 0; iVar6 < (fa->table).ncols; iVar6 = iVar6 + 1) {
        local_94 = step(fa,local_98,iVar6);
        if (local_94 != -1) {
          sVar2 = std::
                  map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                  ::count((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_68,&local_94);
          if (sVar2 == 0) {
            fail("assertion %s failed at %s +%d\n","sr2ss.count(next_state)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
                 ,0x164);
          }
          pmVar3 = std::
                   map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                   ::operator[]((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                                 *)&local_68,&local_94);
          add_transition(__return_storage_ptr__,iVar1,iVar6,*pmVar3);
        }
      }
      iVar6 = accepts(fa,local_98);
      if (iVar6 != -1) {
        add_accept(__return_storage_ptr__,iVar1,iVar6);
      }
      rVar9 = at<bool>((vector<bool,_std::allocator<bool>_> *)&local_90,iVar1);
      *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
    }
    uVar7 = local_98 + 1;
  }
  fail("assertion %s failed at %s +%d\n","sr2ss.count(state)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,0x15e);
}

Assistant:

FiniteAutomaton FiniteAutomaton::simplify_once(FiniteAutomaton const& fa) {
  StateRow2SimpleState sr2ss({fa.table, fa.accepted_tokens});
  int nsimple = 0;
  for (int state = 0; state < get_nstates(fa); ++state) {
    auto res = sr2ss.insert(std::make_pair(state, nsimple));
    if (res.second) {
      ++nsimple;
    }
  }
  FiniteAutomaton out(get_nsymbols(fa), get_determinism(fa), nsimple);
  for (int simple = 0; simple < nsimple; ++simple) {
    add_state(out);
  }
  std::vector<bool> did_simple(size_t(nsimple), false);
  for (int state = 0; state < get_nstates(fa); ++state) {
    OMEGA_H_CHECK(sr2ss.count(state));
    auto simple = sr2ss[state];
    if (at(did_simple, simple)) continue;
    for (int symbol = 0; symbol < get_nsymbols_eps(fa); ++symbol) {
      auto next_state = step(fa, state, symbol);
      if (next_state == -1) continue;
      OMEGA_H_CHECK(sr2ss.count(next_state));
      auto next_simple = sr2ss[next_state];
      add_transition(out, simple, symbol, next_simple);
    }
    auto token = accepts(fa, state);
    if (token != -1) {
      add_accept(out, simple, token);
    }
    at(did_simple, simple) = true;
  }
  return out;
}